

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

bool operator<(period_sidx_map_key *lhs,period_sidx_map_key *rhs)

{
  period_sidx_map_key *rhs_local;
  period_sidx_map_key *lhs_local;
  
  if (lhs->sidx == rhs->sidx) {
    if (lhs->period_no == rhs->period_no) {
      lhs_local._7_1_ = lhs->summary_id < rhs->summary_id;
    }
    else {
      lhs_local._7_1_ = lhs->period_no < rhs->period_no;
    }
  }
  else {
    lhs_local._7_1_ = lhs->sidx < rhs->sidx;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator<(const period_sidx_map_key& lhs, const period_sidx_map_key& rhs)
{

	if (lhs.sidx != rhs.sidx) {
		return lhs.sidx < rhs.sidx;
	}
	else {
		if (lhs.period_no != rhs.period_no) {
			return lhs.period_no < rhs.period_no;
		}
		else {
			return lhs.summary_id < rhs.summary_id;
		}
	}

	
}